

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderText(ImVec2 pos,char *text,char *text_end,bool hide_text_after_hash)

{
  float font_size;
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImFont *font;
  ImGuiContext *pIVar2;
  ImU32 col;
  size_t sVar3;
  undefined7 in_register_00000011;
  ImVec2 local_30;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  local_30 = pos;
  if ((int)CONCAT71(in_register_00000011,hide_text_after_hash) == 0) {
    if (text_end == (char *)0x0) {
      sVar3 = strlen(text);
      text_end = text + sVar3;
    }
  }
  else {
    text_end = FindRenderedTextEnd(text,text_end);
  }
  if (text_end != text) {
    this = pIVar1->DrawList;
    font = pIVar2->Font;
    font_size = pIVar2->FontSize;
    col = GetColorU32(0,1.0);
    ImDrawList::AddText(this,font,font_size,&local_30,col,text,text_end,0.0,(ImVec4 *)0x0);
    if (pIVar2->LogEnabled == true) {
      LogRenderedText(&local_30,text,text_end);
    }
  }
  return;
}

Assistant:

void ImGui::RenderText(ImVec2 pos, const char* text, const char* text_end, bool hide_text_after_hash)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Hide anything after a '##' string
    const char* text_display_end;
    if (hide_text_after_hash)
    {
        text_display_end = FindRenderedTextEnd(text, text_end);
    }
    else
    {
        if (!text_end)
            text_end = text + strlen(text); // FIXME-OPT
        text_display_end = text_end;
    }

    if (text != text_display_end)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end);
        if (g.LogEnabled)
            LogRenderedText(&pos, text, text_display_end);
    }
}